

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

uint __thiscall
llvm::StringRef::edit_distance
          (StringRef *this,StringRef Other,bool AllowReplacements,uint MaxEditDistance)

{
  uint uVar1;
  ArrayRef<char> FromArray;
  ArrayRef<char> ToArray;
  uint MaxEditDistance_local;
  bool AllowReplacements_local;
  StringRef *this_local;
  StringRef Other_local;
  
  Other_local.Data = (char *)Other.Length;
  this_local = (StringRef *)Other.Data;
  FromArray = makeArrayRef<char>(this->Data,this->Length);
  Other_local.Length = (size_t)&this_local;
  ToArray = makeArrayRef<char>((char *)this_local,(size_t)Other_local.Data);
  uVar1 = ComputeEditDistance<char>(FromArray,ToArray,AllowReplacements,MaxEditDistance);
  return uVar1;
}

Assistant:

unsigned StringRef::edit_distance(llvm::StringRef Other,
                                  bool AllowReplacements,
                                  unsigned MaxEditDistance) const {
  return llvm::ComputeEditDistance(
      makeArrayRef(data(), size()),
      makeArrayRef(Other.data(), Other.size()),
      AllowReplacements, MaxEditDistance);
}